

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_ary.c
# Opt level: O0

adt_error_t adt_ary_remove(adt_ary_t *self,void *pElem)

{
  adt_error_t local_25;
  int local_24;
  adt_error_t result;
  int32_t s32Index;
  void *pElem_local;
  adt_ary_t *self_local;
  
  if (self == (adt_ary_t *)0x0) {
    self_local._7_1_ = '\x01';
  }
  else {
    local_25 = '\0';
    for (local_24 = 0; local_24 < self->s32CurLen; local_24 = local_24 + 1) {
      if (self->pFirst[local_24] == pElem) {
        local_25 = adt_ary_splice(self,local_24,1);
        break;
      }
    }
    self_local._7_1_ = local_25;
  }
  return self_local._7_1_;
}

Assistant:

adt_error_t adt_ary_remove(adt_ary_t *self, void *pElem)
{
   if (self != 0)
   {
      int32_t s32Index;
      adt_error_t result = ADT_NO_ERROR;
      for(s32Index = 0; s32Index < self->s32CurLen; s32Index++ )
      {
         if (self->pFirst[s32Index] == pElem){
            result = adt_ary_splice(self, s32Index, 1);
            break;
         }
      }
      return result;
   }
   return ADT_INVALID_ARGUMENT_ERROR;
}